

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::handleFunctionArgument
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments,TIntermTyped *newArg)

{
  int iVar1;
  TPoolAllocator *this_00;
  TType *this_01;
  undefined4 extraout_var;
  TParameter param;
  undefined8 local_48;
  TType *local_40;
  undefined8 local_38;
  
  local_48 = 0;
  this_00 = GetThreadPoolAllocator();
  this_01 = (TType *)TPoolAllocator::allocate(this_00,0x98);
  TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
  local_38 = 0;
  local_40 = this_01;
  iVar1 = (*(newArg->super_TIntermNode)._vptr_TIntermNode[0x1e])(newArg);
  TType::shallowCopy(this_01,(TType *)CONCAT44(extraout_var,iVar1));
  (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function,&local_48);
  if (*arguments != (TIntermTyped *)0x0) {
    newArg = (TIntermTyped *)
             TIntermediate::growAggregate
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        &(*arguments)->super_TIntermNode,&newArg->super_TIntermNode);
  }
  *arguments = newArg;
  return;
}

Assistant:

void HlslParseContext::handleFunctionArgument(TFunction* function,
                                              TIntermTyped*& arguments, TIntermTyped* newArg)
{
    TParameter param = { nullptr, new TType, nullptr };
    param.type->shallowCopy(newArg->getType());

    function->addParameter(param);
    if (arguments)
        arguments = intermediate.growAggregate(arguments, newArg);
    else
        arguments = newArg;
}